

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void __thiscall ObjectBlockPool<16,_4096>::CollectUnmarked(ObjectBlockPool<16,_4096> *this)

{
  SmallBlock<16> **ppSVar1;
  MyLargeBlock *pMVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  SmallBlock<16> *pSVar6;
  uint newSize;
  FastVector<SmallBlock<16>_*,_false,_false> *this_00;
  LargeBlock<16,_4096> *pLVar7;
  ulong uVar8;
  SmallBlock<16> *local_40;
  FastVector<SmallBlock<16>_*,_false,_false> *local_38;
  
  pMVar2 = this->activePages;
  if (pMVar2 != (MyLargeBlock *)0x0) {
    local_38 = &this->objectsToFree;
    uVar4 = (ulong)this->lastNum;
    pLVar7 = pMVar2;
    do {
      if ((pLVar7 != pMVar2) || (iVar3 = (int)uVar4, uVar4 = 0, iVar3 != 0)) {
        pSVar6 = pLVar7->page;
        uVar8 = 0;
        do {
          if ((pSVar6->marker & 3) == 0) {
            if (((uint)pSVar6->marker & 0xc) == 4) {
              newSize = (this->objectsToFinalize).count;
              this_00 = &this->objectsToFinalize;
              if (newSize != (this->objectsToFinalize).max) {
                ppSVar1 = (this->objectsToFinalize).data;
                (this->objectsToFinalize).count = newSize + 1;
LAB_0012086b:
                ppSVar1[newSize] = pSVar6;
                goto LAB_0012086f;
              }
            }
            else {
              newSize = (this->objectsToFree).count;
              this_00 = local_38;
              if (newSize != (this->objectsToFree).max) {
                ppSVar1 = (this->objectsToFree).data;
                (this->objectsToFree).count = newSize + 1;
                goto LAB_0012086b;
              }
            }
            local_40 = pSVar6;
            FastVector<SmallBlock<16>_*,_false,_false>::grow_and_add(this_00,newSize,&local_40);
          }
LAB_0012086f:
          uVar8 = uVar8 + 1;
          pMVar2 = this->activePages;
          uVar4 = (ulong)this->lastNum;
          uVar5 = 0x1000;
          if (pLVar7 == pMVar2) {
            uVar5 = uVar4;
          }
          pSVar6 = pSVar6 + 1;
        } while (uVar8 < uVar5);
      }
      pLVar7 = pLVar7->next;
    } while (pLVar7 != (LargeBlock<16,_4096> *)0x0);
  }
  return;
}

Assistant:

void CollectUnmarked()
	{
		for(MyLargeBlock *curr = activePages; curr; curr = curr->next)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				markerType &marker = curr->page[i].marker;

				if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
				{
					if((marker & NULLC::OBJECT_FINALIZABLE) && !(marker & NULLC::OBJECT_FINALIZED))
					{
						objectsToFinalize.push_back(&curr->page[i]);
					}
					else
					{
						objectsToFree.push_back(&curr->page[i]);
					}
				}
			}
		}
	}